

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControl::findNextPrevAnchor
          (QWidgetTextControl *this,QTextCursor *startCursor,bool next,QTextCursor *newAnchor)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  MoveMode MVar10;
  int iVar11;
  MoveMode MVar12;
  MoveMode MVar13;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QArrayDataPointer<char16_t> local_b8;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined1 local_78 [16];
  QTextDocumentPrivate *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [12];
  int iStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_e8.size = 0;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (char16_t *)0x0;
  if ((int)CONCAT71(in_register_00000011,next) == 0) {
    iVar8 = QTextCursor::selectionStart();
    iVar8 = iVar8 - (uint)(0 < iVar8);
    local_68 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_68);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_90 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::end();
    iVar9 = QTextBlock::position();
    if (iVar8 == iVar9) {
      QTextBlock::begin();
      local_88 = (undefined1 *)CONCAT44(local_88._4_4_,(int)local_b8.size);
      local_98 = (undefined1  [8])local_b8.d;
      uStack_90 = local_b8.ptr;
    }
    else {
      do {
        if (local_98 == (undefined1  [8])local_58._0_8_) {
          if ((int)local_88 != (int)local_48) goto LAB_004833fa;
          local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
          local_68 = (QTextDocumentPrivate *)0x0;
          local_98 = (undefined1  [8])0x0;
          uStack_90 = (char16_t *)0x0;
          puStack_60 = (undefined1 *)((ulong)puStack_60 & 0xffffffff00000000);
        }
        else {
LAB_004833fa:
          QTextBlock::iterator::operator--((iterator *)local_98);
        }
        if ((int)local_88 == uStack_90._4_4_) break;
        QTextBlock::iterator::fragment();
        iVar9 = QTextFragment::position();
        QTextBlock::iterator::fragment();
        iVar11 = QTextFragment::length();
      } while (iVar8 < iVar11 + iVar9 + -1);
    }
    MVar10 = ~MoveAnchor;
    while (cVar5 = QTextBlock::isValid(), cVar5 != '\0') {
      MVar12 = ~MoveAnchor;
      if ((int)local_88 != uStack_90._4_4_) {
        MVar10 = ~MoveAnchor;
        do {
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          QTextFragment::charFormat();
          bVar7 = QTextCharFormat::isAnchor((QTextCharFormat *)&local_c8);
          if ((bVar7) &&
             (cVar5 = QTextFormat::hasProperty((int)(QTextFormat *)&local_c8), cVar5 != '\0')) {
            iVar8 = QTextFragment::position();
            iVar9 = QTextFragment::length();
            MVar10 = iVar9 + iVar8;
            QTextCharFormat::anchorHref((QString *)&local_b8,(QTextCharFormat *)&local_c8);
            qVar4 = local_e8.size;
            pcVar3 = local_e8.ptr;
            pDVar2 = local_e8.d;
            local_e8.d = local_b8.d;
            local_e8.ptr = local_b8.ptr;
            local_b8.d = pDVar2;
            local_b8.ptr = pcVar3;
            local_e8.size = local_b8.size;
            local_b8.size = qVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            bVar7 = false;
          }
          else {
            if (local_98 == (undefined1  [8])local_58._0_8_) {
              if ((int)local_88 != (int)local_48) goto LAB_00483559;
              local_98 = (undefined1  [8])0x0;
              uStack_90 = (char16_t *)0x0;
              local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
            }
            else {
LAB_00483559:
              QTextBlock::iterator::operator--((iterator *)local_98);
            }
            bVar7 = true;
          }
          QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
        } while ((bVar7) && ((int)local_88 != uStack_90._4_4_));
        MVar12 = ~MoveAnchor;
        if ((MVar10 != ~MoveAnchor) && (MVar12 = MVar10, (int)local_88 != uStack_90._4_4_)) {
          MVar12 = ~MoveAnchor;
          goto LAB_0048375f;
        }
      }
      QTextBlock::previous();
      local_68 = (QTextDocumentPrivate *)local_b8.d;
      puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,local_b8.ptr._0_4_);
      QTextBlock::end();
      local_88 = (undefined1 *)CONCAT44(local_88._4_4_,(int)local_b8.size);
      local_98 = (undefined1  [8])local_b8.d;
      uStack_90 = local_b8.ptr;
      QTextBlock::begin();
      if (local_98 == (undefined1  [8])local_b8.d) {
        if ((int)local_88 != (int)local_b8.size) goto LAB_00483603;
      }
      else {
LAB_00483603:
        QTextBlock::iterator::operator--((iterator *)local_98);
      }
      QTextBlock::begin();
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_b8.size);
      local_58._0_8_ = local_b8.d;
      unique0x10000a7a = local_b8.ptr;
      MVar10 = MVar12;
    }
    MVar12 = ~MoveAnchor;
  }
  else {
    iVar8 = QTextCursor::selectionEnd();
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_b8);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    while( true ) {
      if ((int)local_48 == iStack_4c) break;
      QTextBlock::iterator::fragment();
      iVar9 = QTextFragment::position();
      if (iVar8 <= iVar9) break;
      QTextBlock::iterator::operator++((iterator *)local_58);
    }
    while (cVar5 = QTextBlock::isValid(), cVar5 != '\0') {
      MVar10 = ~MoveAnchor;
      while( true ) {
        if ((int)local_48 == iStack_4c) break;
        local_68 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::iterator::fragment();
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextFragment::charFormat();
        bVar6 = QTextCharFormat::isAnchor((QTextCharFormat *)local_78);
        bVar7 = true;
        if ((bVar6) &&
           (cVar5 = QTextFormat::hasProperty((int)(QTextFormat *)local_78), cVar5 != '\0')) {
          MVar10 = QTextFragment::position();
          QTextCharFormat::anchorHref((QString *)local_98,(QTextCharFormat *)local_78);
          qVar4 = local_e8.size;
          pcVar3 = local_e8.ptr;
          pDVar2 = local_e8.d;
          local_e8.d = (Data *)local_98;
          local_e8.ptr = uStack_90;
          local_98 = (undefined1  [8])pDVar2;
          uStack_90 = pcVar3;
          local_e8.size = (qsizetype)local_88;
          local_88 = (undefined1 *)qVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
          bVar7 = false;
        }
        QTextFormat::~QTextFormat((QTextFormat *)local_78);
        if (!bVar7) break;
        QTextBlock::iterator::operator++((iterator *)local_58);
      }
      if (MVar10 != ~MoveAnchor) {
        MVar12 = ~MoveAnchor;
        goto LAB_00483659;
      }
      QTextBlock::next();
      local_b8.d = (Data *)local_98;
      local_b8.ptr = (char16_t *)CONCAT44(local_b8.ptr._4_4_,(int)uStack_90);
      QTextBlock::begin();
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_88);
      local_58._0_8_ = local_98;
      unique0x100009fa = uStack_90;
    }
    MVar10 = ~MoveAnchor;
    MVar12 = MVar10;
  }
LAB_00483853:
  if (MVar12 != ~MoveAnchor && MVar10 != ~MoveAnchor) {
    QTextCursor::operator=(newAnchor,(QTextCursor *)(lVar1 + 0x88));
    QTextCursor::setPosition((int)newAnchor,MVar10);
    QTextCursor::setPosition((int)newAnchor,MVar12);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return MVar12 != ~MoveAnchor && MVar10 != ~MoveAnchor;
  while( true ) {
    if ((int)local_88 == uStack_90._4_4_) break;
LAB_0048375f:
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFragment::charFormat();
    bVar7 = QTextCharFormat::isAnchor((QTextCharFormat *)&local_c8);
    if (bVar7) {
      QTextCharFormat::anchorHref((QString *)&local_b8,(QTextCharFormat *)&local_c8);
      bVar7 = ::operator!=((QString *)&local_b8,(QString *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      if (bVar7) goto LAB_004837c5;
      if (local_98 == (undefined1  [8])local_58._0_8_) {
        if ((int)local_88 != (int)local_48) goto LAB_0048380c;
        local_98 = (undefined1  [8])0x0;
        uStack_90 = (char16_t *)0x0;
        local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
      }
      else {
LAB_0048380c:
        QTextBlock::iterator::operator--((iterator *)local_98);
      }
      bVar7 = true;
    }
    else {
LAB_004837c5:
      iVar8 = QTextFragment::position();
      iVar9 = QTextFragment::length();
      MVar12 = iVar9 + iVar8;
      bVar7 = false;
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
    if (!bVar7) break;
  }
  if (MVar12 == ~MoveAnchor) {
    MVar13 = QTextBlock::position();
    MVar12 = MoveAnchor;
    if (0 < (int)MVar13) {
      MVar12 = MVar13;
    }
  }
  goto LAB_00483853;
LAB_00483659:
  if ((int)local_48 == iStack_4c) goto LAB_0048371d;
  local_68 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::iterator::fragment();
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFragment::charFormat();
  bVar7 = QTextCharFormat::isAnchor((QTextCharFormat *)local_78);
  if (bVar7) {
    QTextCharFormat::anchorHref((QString *)local_98,(QTextCharFormat *)local_78);
    bVar6 = ::operator!=((QString *)local_98,(QString *)&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
    bVar7 = true;
    if (bVar6) goto LAB_004836f6;
  }
  else {
LAB_004836f6:
    MVar12 = QTextFragment::position();
    bVar7 = false;
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  if (!bVar7) goto LAB_0048371d;
  QTextBlock::iterator::operator++((iterator *)local_58);
  goto LAB_00483659;
LAB_0048371d:
  if (MVar12 == ~MoveAnchor) {
    iVar8 = QTextBlock::position();
    iVar9 = QTextBlock::length();
    MVar12 = (iVar8 + iVar9) - KeepAnchor;
  }
  goto LAB_00483853;
}

Assistant:

bool QWidgetTextControl::findNextPrevAnchor(const QTextCursor &startCursor, bool next, QTextCursor &newAnchor)
{
    Q_D(QWidgetTextControl);

    int anchorStart = -1;
    QString anchorHref;
    int anchorEnd = -1;

    if (next) {
        const int startPos = startCursor.selectionEnd();

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator it = block.begin();

        while (!it.atEnd() && it.fragment().position() < startPos)
            ++it;

        while (block.isValid()) {
            anchorStart = -1;

            // find next anchor
            for (; !it.atEnd(); ++it) {
                const QTextFragment fragment = it.fragment();
                const QTextCharFormat fmt = fragment.charFormat();

                if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                    anchorStart = fragment.position();
                    anchorHref = fmt.anchorHref();
                    break;
                }
            }

            if (anchorStart != -1) {
                anchorEnd = -1;

                // find next non-anchor fragment
                for (; !it.atEnd(); ++it) {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position();
                        break;
                    }
                }

                if (anchorEnd == -1)
                    anchorEnd = block.position() + block.length() - 1;

                // make found selection
                break;
            }

            block = block.next();
            it = block.begin();
        }
    } else {
        int startPos = startCursor.selectionStart();
        if (startPos > 0)
            --startPos;

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator blockStart = block.begin();
        QTextBlock::Iterator it = block.end();

        if (startPos == block.position()) {
            it = block.begin();
        } else {
            do {
                if (it == blockStart) {
                    it = QTextBlock::Iterator();
                    block = QTextBlock();
                } else {
                    --it;
                }
            } while (!it.atEnd() && it.fragment().position() + it.fragment().length() - 1 > startPos);
        }

        while (block.isValid()) {
            anchorStart = -1;

            if (!it.atEnd()) {
                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                        anchorStart = fragment.position() + fragment.length();
                        anchorHref = fmt.anchorHref();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());
            }

            if (anchorStart != -1 && !it.atEnd()) {
                anchorEnd = -1;

                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position() + fragment.length();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());

                if (anchorEnd == -1)
                    anchorEnd = qMax(0, block.position());

                break;
            }

            block = block.previous();
            it = block.end();
            if (it != block.begin())
                --it;
            blockStart = block.begin();
        }

    }

    if (anchorStart != -1 && anchorEnd != -1) {
        newAnchor = d->cursor;
        newAnchor.setPosition(anchorStart);
        newAnchor.setPosition(anchorEnd, QTextCursor::KeepAnchor);
        return true;
    }

    return false;
}